

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall
wasm::PrintExpressionContents::visitStructNew(PrintExpressionContents *this,StructNew *curr)

{
  ostream *poVar1;
  bool bVar2;
  HeapType type;
  TypeNamePrinter local_78;
  
  bVar2 = printUnreachableReplacement(this,(Expression *)curr);
  if (!bVar2) {
    poVar1 = this->o;
    Colors::outputColorCode(poVar1,"\x1b[35m");
    Colors::outputColorCode(poVar1,"\x1b[1m");
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"struct.new",10);
    Colors::outputColorCode(poVar1,"\x1b[0m");
    if ((curr->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
        usedElements == 0) {
      poVar1 = this->o;
      Colors::outputColorCode(poVar1,"\x1b[35m");
      Colors::outputColorCode(poVar1,"\x1b[1m");
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_default",8);
      Colors::outputColorCode(poVar1,"\x1b[0m");
    }
    local_78.wasm = (Module *)CONCAT71(local_78.wasm._1_7_,0x20);
    std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_78,1);
    local_78.wasm = this->wasm;
    local_78.os = this->o;
    local_78.currHeapTypeDepth = 0;
    local_78.heapTypeDepths._M_h._M_buckets = &local_78.heapTypeDepths._M_h._M_single_bucket;
    local_78.heapTypeDepths._M_h._M_bucket_count = 1;
    local_78.heapTypeDepths._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_78.heapTypeDepths._M_h._M_element_count = 0;
    local_78.heapTypeDepths._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_78.heapTypeDepths._M_h._M_rehash_policy._M_next_resize = 0;
    local_78.heapTypeDepths._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_78.prints = 0;
    type = wasm::Type::getHeapType
                     (&(curr->super_SpecificExpression<(wasm::Expression::Id)60>).super_Expression.
                       type);
    anon_unknown_217::TypeNamePrinter::print(&local_78,type);
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_78.heapTypeDepths._M_h);
  }
  return;
}

Assistant:

void visitStructNew(StructNew* curr) {
    if (printUnreachableReplacement(curr)) {
      return;
    }
    printMedium(o, "struct.new");
    if (curr->isWithDefault()) {
      printMedium(o, "_default");
    }
    o << ' ';
    TypeNamePrinter(o, wasm).print(curr->type.getHeapType());
  }